

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CManageClient.cpp
# Opt level: O2

bool __thiscall CManageClient::IsInWhiteList(CManageClient *this,in_addr_t ip)

{
  bool bVar1;
  ArrayIndex AVar2;
  in_addr_t iVar3;
  Value *pVVar4;
  int i;
  uint index;
  Value allow_ip;
  string balst_ip;
  Value local_70;
  string local_48;
  
  bVar1 = Json::Value::empty(&this->m_Config);
  index = 0;
  if (!bVar1) {
    pVVar4 = Json::Value::operator[](&this->m_Config,"white");
    Json::Value::Value(&local_70,pVVar4);
    do {
      AVar2 = Json::Value::size(&local_70);
      if (AVar2 <= index) {
        Json::Value::~Value(&local_70);
        index = 0;
        goto LAB_001095bd;
      }
      pVVar4 = Json::Value::operator[](&local_70,index);
      Json::Value::asString_abi_cxx11_(&local_48,pVVar4);
      iVar3 = inet_addr(local_48._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_48);
      index = index + 1;
    } while (iVar3 != ip);
    Json::Value::~Value(&local_70);
    index = 1;
  }
LAB_001095bd:
  return SUB41(index,0);
}

Assistant:

bool CManageClient::IsInWhiteList(in_addr_t ip) const {
    if(!m_Config.empty()){
        Json::Value allow_ip = m_Config["white"];
        for(int i = 0;i < allow_ip.size();i++){
            string balst_ip = allow_ip[i].asString();
            if(ip == inet_addr(balst_ip.c_str())){
                return true;
            }
        }
    }
    return false;
}